

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_newline(CPState *cp)

{
  uint uVar1;
  CPChar c;
  CPState *cp_local;
  
  uVar1 = (uint)(byte)*cp->p;
  if ((uVar1 == 10 || uVar1 == 0xd) && (uVar1 != cp->c)) {
    cp->p = cp->p + 1;
  }
  cp->linenumber = cp->linenumber + 1;
  return;
}

Assistant:

static void cp_newline(CPState *cp)
{
  CPChar c = cp_rawpeek(cp);
  if (cp_iseol(c) && c != cp->c) cp->p++;
  cp->linenumber++;
}